

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Shutdown(ImGuiContext *context)

{
  int *piVar1;
  ImFontAtlas *p;
  char *pcVar2;
  ImGuiContextHook *pIVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindowStackData *pIVar5;
  ImGuiColorMod *pIVar6;
  ImGuiStyleMod *pIVar7;
  ImFont **ppIVar8;
  ImGuiPopupData *pIVar9;
  ImGuiViewportP **ppIVar10;
  ImGuiPtrOrIndex *pIVar11;
  ImGuiShrinkWidthItem *pIVar12;
  void *pvVar13;
  ImGuiListClipperData *pIVar14;
  ImGuiTableTempData *pIVar15;
  ImDrawChannel *pIVar16;
  uint *puVar17;
  ImGuiSettingsHandler *pIVar18;
  FILE *__stream;
  ImGuiContext *pIVar19;
  int iVar20;
  ImGuiContext *g;
  long lVar21;
  long lVar22;
  
  p = (context->IO).Fonts;
  if ((p != (ImFontAtlas *)0x0) && (context->FontAtlasOwnedByContext == true)) {
    p->Locked = false;
    IM_DELETE<ImFontAtlas>(p);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar19 = GImGui;
  if (context->Initialized == true) {
    if ((context->SettingsLoaded == true) &&
       (pcVar2 = (context->IO).IniFilename, pcVar2 != (char *)0x0)) {
      GImGui = context;
      SaveIniSettingsToDisk(pcVar2);
    }
    iVar20 = (context->Hooks).Size;
    GImGui = pIVar19;
    if (0 < iVar20) {
      lVar21 = 0;
      lVar22 = 0;
      do {
        pIVar3 = (context->Hooks).Data;
        if (*(int *)(pIVar3 + lVar21 + 4) == 6) {
          (**(code **)(pIVar3 + lVar21 + 0x10))(context,pIVar3 + lVar21);
          iVar20 = (context->Hooks).Size;
        }
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x20;
      } while (lVar22 < iVar20);
    }
    if (0 < (context->Windows).Size) {
      lVar21 = 0;
      do {
        IM_DELETE<ImGuiWindow>((context->Windows).Data[lVar21]);
        lVar21 = lVar21 + 1;
      } while (lVar21 < (context->Windows).Size);
    }
    ppIVar4 = (context->Windows).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      (context->Windows).Size = 0;
      (context->Windows).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->Windows).Data = (ImGuiWindow **)0x0;
    }
    ppIVar4 = (context->WindowsFocusOrder).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      (context->WindowsFocusOrder).Size = 0;
      (context->WindowsFocusOrder).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->WindowsFocusOrder).Data = (ImGuiWindow **)0x0;
    }
    ppIVar4 = (context->WindowsTempSortBuffer).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      (context->WindowsTempSortBuffer).Size = 0;
      (context->WindowsTempSortBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->WindowsTempSortBuffer).Data = (ImGuiWindow **)0x0;
    }
    context->CurrentWindow = (ImGuiWindow *)0x0;
    pIVar5 = (context->CurrentWindowStack).Data;
    if (pIVar5 != (ImGuiWindowStackData *)0x0) {
      (context->CurrentWindowStack).Size = 0;
      (context->CurrentWindowStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      (context->CurrentWindowStack).Data = (ImGuiWindowStackData *)0x0;
    }
    ImGuiStorage::Clear(&context->WindowsById);
    context->NavWindow = (ImGuiWindow *)0x0;
    context->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    pIVar6 = (context->ColorStack).Data;
    if (pIVar6 != (ImGuiColorMod *)0x0) {
      (context->ColorStack).Size = 0;
      (context->ColorStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      (context->ColorStack).Data = (ImGuiColorMod *)0x0;
    }
    pIVar7 = (context->StyleVarStack).Data;
    if (pIVar7 != (ImGuiStyleMod *)0x0) {
      (context->StyleVarStack).Size = 0;
      (context->StyleVarStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
      (context->StyleVarStack).Data = (ImGuiStyleMod *)0x0;
    }
    ppIVar8 = (context->FontStack).Data;
    if (ppIVar8 != (ImFont **)0x0) {
      (context->FontStack).Size = 0;
      (context->FontStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
      (context->FontStack).Data = (ImFont **)0x0;
    }
    pIVar9 = (context->OpenPopupStack).Data;
    if (pIVar9 != (ImGuiPopupData *)0x0) {
      (context->OpenPopupStack).Size = 0;
      (context->OpenPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      (context->OpenPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    pIVar9 = (context->BeginPopupStack).Data;
    if (pIVar9 != (ImGuiPopupData *)0x0) {
      (context->BeginPopupStack).Size = 0;
      (context->BeginPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      (context->BeginPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    if (0 < (context->Viewports).Size) {
      lVar21 = 0;
      do {
        IM_DELETE<ImGuiViewportP>((context->Viewports).Data[lVar21]);
        lVar21 = lVar21 + 1;
      } while (lVar21 < (context->Viewports).Size);
    }
    ppIVar10 = (context->Viewports).Data;
    if (ppIVar10 != (ImGuiViewportP **)0x0) {
      (context->Viewports).Size = 0;
      (context->Viewports).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
      (context->Viewports).Data = (ImGuiViewportP **)0x0;
    }
    ImPool<ImGuiTabBar>::Clear(&context->TabBars);
    pIVar11 = (context->CurrentTabBarStack).Data;
    if (pIVar11 != (ImGuiPtrOrIndex *)0x0) {
      (context->CurrentTabBarStack).Size = 0;
      (context->CurrentTabBarStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
      (context->CurrentTabBarStack).Data = (ImGuiPtrOrIndex *)0x0;
    }
    pIVar12 = (context->ShrinkWidthBuffer).Data;
    if (pIVar12 != (ImGuiShrinkWidthItem *)0x0) {
      (context->ShrinkWidthBuffer).Size = 0;
      (context->ShrinkWidthBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar12,GImAllocatorUserData);
      (context->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)0x0;
    }
    iVar20 = (context->ClipperTempData).Size;
    if (0 < iVar20) {
      lVar21 = 0x20;
      lVar22 = 0;
      do {
        pvVar13 = *(void **)((long)&((context->ClipperTempData).Data)->ListClipper + lVar21);
        if (pvVar13 != (void *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar13,GImAllocatorUserData);
          iVar20 = (context->ClipperTempData).Size;
        }
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x28;
      } while (lVar22 < iVar20);
    }
    pIVar14 = (context->ClipperTempData).Data;
    if (pIVar14 != (ImGuiListClipperData *)0x0) {
      (context->ClipperTempData).Size = 0;
      (context->ClipperTempData).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar14,GImAllocatorUserData);
      (context->ClipperTempData).Data = (ImGuiListClipperData *)0x0;
    }
    ImPool<ImGuiTable>::Clear(&context->Tables);
    if (0 < (context->TablesTempData).Size) {
      lVar21 = 0x10;
      lVar22 = 0;
      do {
        pIVar15 = (context->TablesTempData).Data;
        ImDrawListSplitter::ClearFreeMemory
                  ((ImDrawListSplitter *)((long)&pIVar15->TableIndex + lVar21));
        pvVar13 = *(void **)((long)&(pIVar15->DrawSplitter)._Current + lVar21);
        if (pvVar13 != (void *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar13,GImAllocatorUserData);
        }
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x70;
      } while (lVar22 < (context->TablesTempData).Size);
    }
    pIVar15 = (context->TablesTempData).Data;
    if (pIVar15 != (ImGuiTableTempData *)0x0) {
      (context->TablesTempData).Size = 0;
      (context->TablesTempData).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
      (context->TablesTempData).Data = (ImGuiTableTempData *)0x0;
    }
    pIVar16 = (context->DrawChannelsTempMergeBuffer).Data;
    if (pIVar16 != (ImDrawChannel *)0x0) {
      (context->DrawChannelsTempMergeBuffer).Size = 0;
      (context->DrawChannelsTempMergeBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
      (context->DrawChannelsTempMergeBuffer).Data = (ImDrawChannel *)0x0;
    }
    pcVar2 = (context->ClipboardHandlerData).Data;
    if (pcVar2 != (char *)0x0) {
      (context->ClipboardHandlerData).Size = 0;
      (context->ClipboardHandlerData).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
      (context->ClipboardHandlerData).Data = (char *)0x0;
    }
    puVar17 = (context->MenusIdSubmittedThisFrame).Data;
    if (puVar17 != (uint *)0x0) {
      (context->MenusIdSubmittedThisFrame).Size = 0;
      (context->MenusIdSubmittedThisFrame).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar17,GImAllocatorUserData);
      (context->MenusIdSubmittedThisFrame).Data = (uint *)0x0;
    }
    ImGuiInputTextState::ClearFreeMemory(&context->InputTextState);
    ImChunkStream<ImGuiWindowSettings>::clear(&context->SettingsWindows);
    pIVar18 = (context->SettingsHandlers).Data;
    if (pIVar18 != (ImGuiSettingsHandler *)0x0) {
      (context->SettingsHandlers).Size = 0;
      (context->SettingsHandlers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
      (context->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
    }
    __stream = (FILE *)context->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream != _stdout) {
        fclose(__stream);
      }
      context->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear(&context->LogBuffer);
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    g.Windows.clear_delete();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.Viewports.clear_delete();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipperTempData.clear_destruct();

    g.Tables.Clear();
    g.TablesTempData.clear_destruct();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}